

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint64_t helper_float_rsqrt1_d_mips64(CPUMIPSState_conflict5 *env,uint64_t fdt0)

{
  float_status *s;
  byte bVar1;
  uint uVar2;
  float64 fVar3;
  uint uVar4;
  uint uVar5;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar3 = float64_sqrt_mips64(fdt0,s);
  fVar3 = float64_div_mips64(0x3ff0000000000000,fVar3,s);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
  }
  uVar2 = (env->active_fpu).fcr31;
  uVar5 = uVar4 << 0xc | uVar2 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar5;
  if (uVar4 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar4 & uVar2 >> 7) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar5 | uVar4 << 2;
  }
  return fVar3;
}

Assistant:

uint64_t helper_float_rsqrt1_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t fdt2;

    fdt2 = float64_sqrt(fdt0, &env->active_fpu.fp_status);
    fdt2 = float64_div(float64_one, fdt2, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fdt2;
}